

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::valGlue
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProStringList *varList,
          QString *before,QString *glue,QString *after)

{
  QString *pQVar1;
  QString *pQVar2;
  QString *pQVar3;
  ProString *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  if ((varList->super_QList<ProString>).d.size != 0) {
    this_00 = (varList->super_QList<ProString>).d.ptr;
    do {
      if (this_00->m_length != 0) {
        if (local_78.d.size != 0) {
          QString::append((QString *)&local_78);
        }
        ProString::toQString((QString *)&local_58,this_00);
        QString::append((QString *)&local_78);
        if ((QArrayData *)local_58.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_58.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_58.a.a,2,0x10);
          }
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (varList->super_QList<ProString>).d.ptr + (varList->super_QList<ProString>).d.size);
  }
  if (local_78.d.size == 0) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar4);
    pQVar3 = local_58.b;
    pQVar2 = local_58.a.b;
    pQVar1 = local_58.a.a;
    local_58.a.a = (QString *)0x0;
    local_58.a.b = (QString *)0x0;
    (__return_storage_ptr__->d).d = (Data *)pQVar1;
    (__return_storage_ptr__->d).ptr = (char16_t *)pQVar2;
    local_58.b = (QString *)0x0;
    (__return_storage_ptr__->d).size = (qsizetype)pQVar3;
  }
  else {
    local_58.a.b = &local_78;
    local_58.a.a = before;
    local_58.b = after;
    QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::convertTo<QString>
              (__return_storage_ptr__,&local_58);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valGlue(const ProStringList &varList, const QString &before, const QString &glue, const QString &after) const
{
    QString ret;
    for (ProStringList::ConstIterator it = varList.begin(); it != varList.end(); ++it) {
        if (!(*it).isEmpty()) {
            if (!ret.isEmpty())
                ret += glue;
            ret += (*it).toQString();
        }
    }
    return ret.isEmpty() ? QString("") : before + ret + after;
}